

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O2

void extendResult(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *result,vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          *contents)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  int iVar2;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  __last;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  __first;
  const_iterator __position;
  
  __position._M_current =
       (result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((result->
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      )._M_impl.super__Vector_impl_data._M_start != __position._M_current) {
    iVar2 = (*__position._M_current[-1]->_vptr_cmGeneratorExpressionEvaluator[2])();
    if (iVar2 == 0) {
      iVar2 = (*(*(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_vptr_cmGeneratorExpressionEvaluator
                [2])();
      __position._M_current =
           (result->
           super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2 == 0) {
        pcVar1 = *(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __position._M_current[-1][2]._vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)
             ((long)__position._M_current[-1][2]._vptr_cmGeneratorExpressionEvaluator +
             (long)pcVar1[2]._vptr_cmGeneratorExpressionEvaluator);
        (*pcVar1->_vptr_cmGeneratorExpressionEvaluator[1])();
        __position._M_current =
             (result->
             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        __last._M_current =
             (contents->
             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        __first._M_current =
             (contents->
             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_002f3bb2;
      }
    }
    else {
      __position._M_current =
           (result->
           super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  __first._M_current =
       (contents->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (contents->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_002f3bb2:
  std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
  insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>,void>
            ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
              *)result,__position,__first,__last);
  return;
}

Assistant:

static void extendResult(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  const std::vector<cmGeneratorExpressionEvaluator*>& contents)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text &&
      contents.front()->GetType() == cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(
      static_cast<TextContent*>(contents.front())->GetLength());
    delete contents.front();
    result.insert(result.end(), contents.begin() + 1, contents.end());
  } else {
    result.insert(result.end(), contents.begin(), contents.end());
  }
}